

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_env.cc
# Opt level: O1

string * __thiscall
BindingEnv::LookupWithFallback
          (string *__return_storage_ptr__,BindingEnv *this,string *var,EvalString *eval,Env *env)

{
  BindingEnv *pBVar1;
  iterator iVar2;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->bindings_)._M_t,var);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->bindings_)._M_t._M_impl.super__Rb_tree_header) {
    if (eval == (EvalString *)0x0) {
      pBVar1 = this->parent_;
      if (pBVar1 == (BindingEnv *)0x0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      }
      else {
        (*(pBVar1->super_Env)._vptr_Env[2])(__return_storage_ptr__,pBVar1,var);
      }
    }
    else {
      EvalString::Evaluate_abi_cxx11_(__return_storage_ptr__,eval,env);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*(long *)(iVar2._M_node + 2),
               (long)&(iVar2._M_node[2]._M_parent)->_M_color + *(long *)(iVar2._M_node + 2));
  }
  return __return_storage_ptr__;
}

Assistant:

string BindingEnv::LookupWithFallback(const string& var,
                                      const EvalString* eval,
                                      Env* env) {
  map<string, string>::iterator i = bindings_.find(var);
  if (i != bindings_.end())
    return i->second;

  if (eval)
    return eval->Evaluate(env);

  if (parent_)
    return parent_->LookupVariable(var);

  return "";
}